

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O3

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabled<(Memory::ObjectInfoBits)0>(HeapInfo *this,size_t size)

{
  undefined1 uVar1;
  uint uVar2;
  BucketType *pBVar3;
  ulong sizeCat;
  
  if (this->isPageHeapEnabled == true) {
    sizeCat = size + 0xf & 0xfffffffffffffff0;
    if (size < 0x301) {
      pBVar3 = GetBucket<(Memory::ObjectInfoBits)0>(this,sizeCat);
      uVar1 = (pBVar3->
              super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
              ).super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>.
              super_HeapBucket.isPageHeapEnabled;
    }
    else if (size - 0x301 < 0x1d00) {
      uVar2 = GetMediumBucketIndex(sizeCat);
      uVar1 = this->mediumHeapBuckets[uVar2].heapBucket.
              super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
              .super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
              super_HeapBucket.isPageHeapEnabled;
    }
    else {
      uVar1 = (this->largeObjectBucket).super_HeapBucket.isPageHeapEnabled;
    }
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool IsPageHeapEnabled(size_t size)
    {
        if (IsPageHeapEnabled())
        {
            size_t sizeCat = HeapInfo::GetAlignedSizeNoCheck(size);
            if (HeapInfo::IsSmallObject(size))
            {
                auto& bucket = this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else if (HeapInfo::IsMediumObject(size))
            {
                auto& bucket = this->GetMediumBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else
            {
                return this->largeObjectBucket.IsPageHeapEnabled(attributes);
            }
        }
        return false;
    }